

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::addResolveImageWholeCopyBeforeResolvingTests(TestCaseGroup *group)

{
  uint uVar1;
  TestContext *testCtx;
  ResolveImageToImageTestCase *node;
  pointer __src;
  long *plVar2;
  pointer __dest;
  long lVar3;
  VkSampleCountFlagBits sampleFlag;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar4;
  VkDeviceSize *pVVar5;
  _anonymous_namespace_ *this;
  value_type *pvVar6;
  ulong __n;
  CopyRegion imageResolve;
  string local_168;
  ResolveImageToImageTestCase *local_148;
  pointer local_140;
  _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  *local_138;
  long local_130;
  Buffer local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  local_f8;
  uint local_e0;
  undefined1 local_d8 [80];
  Data local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  pointer pCStack_50;
  long local_48;
  uint local_40;
  
  local_f8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.size = 0x2500000001;
  uStack_120 = 0x4000000040;
  local_118 = 0x600000001;
  uStack_110 = 0x2500000001;
  local_108 = 0x4000000040;
  uStack_100 = 0x700000001;
  pVVar5 = &DAT_00ad7ea8;
  pvVar6 = (value_type *)local_d8;
  for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pvVar6->bufferCopy).srcOffset = *pVVar5;
    pVVar5 = pVVar5 + 1;
    pvVar6 = (value_type *)&(pvVar6->bufferCopy).dstOffset;
  }
  local_d8._64_4_ = 1;
  std::
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ::push_back(&local_f8,(value_type *)local_d8);
  __src = local_f8.
          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_140 = local_f8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)local_f8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_f8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_138 = (_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
               *)(((long)__n >> 4) * -0x3333333333333333);
  lVar3 = 0;
  uVar4 = extraout_RDX;
  do {
    uVar1 = *(uint *)((long)&api::(anonymous_namespace)::samples + lVar3);
    local_130 = lVar3;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              (&local_168,(_anonymous_namespace_ *)(ulong)uVar1,(VkSampleCountFlagBits)uVar4);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0xad6d23);
    pVVar5 = (VkDeviceSize *)(plVar2 + 2);
    if ((VkDeviceSize *)*plVar2 == pVVar5) {
      local_d8._16_8_ = *pVVar5;
      local_d8._24_8_ = plVar2[3];
      local_d8._0_8_ = local_d8 + 0x10;
    }
    else {
      local_d8._16_8_ = *pVVar5;
      local_d8._0_8_ = (VkDeviceSize *)*plVar2;
    }
    local_d8._8_8_ = plVar2[1];
    *plVar2 = (long)pVVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    local_148 = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = (group->super_TestNode).m_testCtx;
    this = (_anonymous_namespace_ *)(ulong)uVar1;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_(&local_168,this,sampleFlag);
    local_68 = local_108;
    uStack_60 = uStack_100;
    local_88._16_8_ = local_118;
    uStack_70 = uStack_110;
    local_88.buffer.size = (Buffer)(Buffer)local_128.size;
    local_88._8_8_ = uStack_120;
    local_58 = (pointer)0x0;
    pCStack_50 = (pointer)0x0;
    local_48 = 0;
    __dest = std::
             _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ::_M_allocate(local_138,(size_t)this);
    lVar3 = (long)__dest + __n;
    local_58 = __dest;
    local_48 = lVar3;
    if (local_140 != __src) {
      pCStack_50 = __dest;
      memmove(__dest,__src,__n);
    }
    node = local_148;
    pCStack_50 = (pointer)lVar3;
    local_40 = uVar1;
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (local_148,testCtx,&local_168,(string *)local_d8,(TestParams *)&local_88.buffer,
               COPY_MS_IMAGE_TO_MS_IMAGE);
    tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)node);
    uVar4 = extraout_RDX_00;
    if (__dest != (pointer)0x0) {
      operator_delete(__dest,__n);
      uVar4 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      uVar4 = extraout_RDX_02;
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      uVar4 = extraout_RDX_03;
    }
    lVar3 = local_130 + 4;
  } while (lVar3 != 0x18);
  if (local_f8.
      super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_e0 = uVar1;
    operator_delete(local_f8.
                    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addResolveImageWholeCopyBeforeResolvingTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspectFlags	aspectMask;
			0u,							// uint32_t				mipLevel;
			0u,							// uint32_t				baseArrayLayer;
			1u							// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_MS_IMAGE));
	}
}